

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

size_type cmSystemToolsFindRPath(string *have,string *want)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (have->_M_string_length == 0) {
    return 0xffffffffffffffff;
  }
  uVar3 = 0;
  do {
    sVar1 = std::__cxx11::string::find((char *)have,(ulong)(want->_M_dataplus)._M_p,uVar3);
    if (sVar1 == 0) {
LAB_0012c9fd:
      uVar3 = want->_M_string_length + sVar1;
      uVar2 = have->_M_string_length;
      if (uVar2 <= uVar3) {
        return sVar1;
      }
      if ((have->_M_dataplus)._M_p[uVar3] == ':') {
        return sVar1;
      }
    }
    else {
      if (sVar1 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      if ((have->_M_dataplus)._M_p[sVar1 - 1] == ':') goto LAB_0012c9fd;
      uVar2 = have->_M_string_length;
    }
    uVar3 = sVar1 + 1;
    if (uVar2 <= uVar3) {
      return 0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

std::string::size_type cmSystemToolsFindRPath(std::string const& have,
                                              std::string const& want)
{
  std::string::size_type pos = 0;
  while (pos < have.size()) {
    // Look for an occurrence of the string.
    std::string::size_type const beg = have.find(want, pos);
    if (beg == std::string::npos) {
      return std::string::npos;
    }

    // Make sure it is separated from preceding entries.
    if (beg > 0 && have[beg - 1] != ':') {
      pos = beg + 1;
      continue;
    }

    // Make sure it is separated from following entries.
    std::string::size_type const end = beg + want.size();
    if (end < have.size() && have[end] != ':') {
      pos = beg + 1;
      continue;
    }

    // Return the position of the path portion.
    return beg;
  }

  // The desired rpath was not found.
  return std::string::npos;
}